

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

void add_noise_to_block(aom_film_grain_t *params,uint8_t *luma,uint8_t *cb,uint8_t *cr,
                       int luma_stride,int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain
                       ,int luma_grain_stride,int chroma_grain_stride,int half_luma_height,
                       int half_luma_width,int bit_depth,int chroma_subsamp_y,int chroma_subsamp_x,
                       int mc_identity)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint8_t uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int j;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  bool bVar24;
  bool bVar25;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  uint8_t *local_80;
  int *local_70;
  int *local_68;
  int *local_60;
  uint uVar14;
  
  iVar6 = 1 << ((char)params->scaling_shift - 1U & 0x1f);
  bVar24 = true;
  if (params->num_cb_points < 1) {
    bVar24 = params->chroma_scaling_from_luma != 0;
  }
  iVar8 = params->num_cr_points;
  bVar25 = params->chroma_scaling_from_luma == 0;
  if (bVar25) {
    local_94 = params->cb_mult + -0x80;
    local_90 = params->cb_luma_mult + -0x80;
    local_98 = params->cb_offset + -0x100;
    local_8c = params->cr_mult + -0x80;
    local_88 = params->cr_luma_mult + -0x80;
    local_84 = params->cr_offset + -0x100;
  }
  else {
    local_84 = 0;
    local_8c = 0;
    local_98 = 0;
    local_88 = 0x40;
    local_90 = 0x40;
    local_94 = 0;
  }
  iVar12 = params->clip_to_restricted_range;
  iVar23 = 0xff;
  if (iVar12 != 0) {
    iVar23 = (uint)(mc_identity == 0) * 5 + 0xeb;
  }
  bVar2 = 1 - (byte)chroma_subsamp_y & 0x1f;
  local_68 = cr_grain;
  bVar3 = 1U - (char)chroma_subsamp_x & 0x1f;
  local_70 = cb_grain;
  local_60 = luma_grain;
  iVar1 = params->num_y_points;
  uVar14 = (uint)(iVar12 != 0);
  iVar13 = uVar14 * 0x10;
  iVar17 = (0x100 << ((char)bit_depth - 8U & 0x1f)) + -1;
  uVar4 = half_luma_width << bVar3;
  if (half_luma_width << bVar3 < 1) {
    uVar4 = 0;
  }
  uVar5 = half_luma_height << bVar2;
  if (half_luma_height << bVar2 < 1) {
    uVar5 = 0;
  }
  local_80 = cr;
  for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
    iVar15 = ((int)uVar16 << ((byte)chroma_subsamp_y & 0x1f)) * luma_stride;
    lVar9 = (long)iVar15;
    for (uVar20 = 0; uVar4 != uVar20; uVar20 = uVar20 + 1) {
      if (chroma_subsamp_x == 0) {
        uVar22 = (uint)luma[uVar20 + lVar9];
      }
      else {
        uVar22 = (uint)luma[(long)iVar15 + 1] + (uint)luma[iVar15] + 1 >> 1 & 0xff;
      }
      if (bVar24) {
        iVar7 = ((int)(local_94 * (uint)cb[uVar20] + uVar22 * local_90) >> 6) + local_98;
        iVar11 = iVar7;
        if (iVar17 <= iVar7) {
          iVar11 = iVar17;
        }
        if (iVar7 < 0) {
          iVar11 = 0;
        }
        iVar7 = (local_70[uVar20] * scaling_lut_cb[iVar11] + iVar6 >>
                ((byte)params->scaling_shift & 0x1f)) + (uint)cb[uVar20];
        iVar11 = iVar7;
        if (iVar23 <= iVar7) {
          iVar11 = iVar23;
        }
        iVar19 = iVar13;
        if (SBORROW4(iVar7,iVar13) == (int)(iVar7 + uVar14 * -0x10) < 0) {
          iVar19 = iVar11;
        }
        cb[uVar20] = (uint8_t)iVar19;
      }
      if (0 < iVar8 || !bVar25) {
        iVar7 = ((int)(local_8c * (uint)local_80[uVar20] + uVar22 * local_88) >> 6) + local_84;
        iVar11 = iVar7;
        if (iVar17 <= iVar7) {
          iVar11 = iVar17;
        }
        if (iVar7 < 0) {
          iVar11 = 0;
        }
        iVar7 = (local_68[uVar20] * scaling_lut_cr[iVar11] + iVar6 >>
                ((byte)params->scaling_shift & 0x1f)) + (uint)local_80[uVar20];
        iVar11 = iVar7;
        if (iVar23 <= iVar7) {
          iVar11 = iVar23;
        }
        iVar19 = iVar13;
        if (SBORROW4(iVar7,iVar13) == (int)(iVar7 + uVar14 * -0x10) < 0) {
          iVar19 = iVar11;
        }
        local_80[uVar20] = (uint8_t)iVar19;
      }
      iVar15 = iVar15 + 2;
    }
    local_68 = local_68 + chroma_grain_stride;
    local_80 = local_80 + chroma_stride;
    local_70 = local_70 + chroma_grain_stride;
    cb = cb + chroma_stride;
  }
  iVar8 = 0xeb;
  if (iVar12 == 0) {
    iVar8 = 0xff;
  }
  if (0 < iVar1) {
    uVar20 = 0;
    uVar16 = (ulong)(uint)(half_luma_width * 2);
    if (half_luma_width * 2 < 1) {
      uVar16 = uVar20;
    }
    uVar21 = (ulong)(uint)(half_luma_height * 2);
    if (half_luma_height * 2 < 1) {
      uVar21 = uVar20;
    }
    for (; uVar20 != uVar21; uVar20 = uVar20 + 1) {
      for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        iVar23 = (local_60[uVar18] * scaling_lut_y[luma[uVar18]] + iVar6 >>
                 ((byte)params->scaling_shift & 0x1f)) + (uint)luma[uVar18];
        iVar12 = iVar23;
        if (iVar8 <= iVar23) {
          iVar12 = iVar8;
        }
        uVar10 = (uint8_t)iVar12;
        if (SBORROW4(iVar23,iVar13) != (int)(iVar23 + uVar14 * -0x10) < 0) {
          uVar10 = (uint8_t)iVar13;
        }
        luma[uVar18] = uVar10;
      }
      local_60 = local_60 + luma_grain_stride;
      luma = luma + luma_stride;
    }
  }
  return;
}

Assistant:

static void add_noise_to_block(const aom_film_grain_t *params, uint8_t *luma,
                               uint8_t *cb, uint8_t *cr, int luma_stride,
                               int chroma_stride, int *luma_grain,
                               int *cb_grain, int *cr_grain,
                               int luma_grain_stride, int chroma_grain_stride,
                               int half_luma_height, int half_luma_width,
                               int bit_depth, int chroma_subsamp_y,
                               int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  int cb_offset = params->cb_offset - 256;

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  int cr_offset = params->cr_offset - 256;

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range;
    max_luma = max_luma_legal_range;

    if (mc_identity) {
      min_chroma = min_luma_legal_range;
      max_chroma = max_luma_legal_range;
    } else {
      min_chroma = min_chroma_legal_range;
      max_chroma = max_chroma_legal_range;
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = 255;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }

      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j], 8) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}